

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::
vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
::vector(vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
         *this,size_t count,optional<std::pair<pbrt::LightHandle,_unsigned_long>_> *value,
        polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_> *alloc)

{
  undefined8 *in_RCX;
  size_t in_RDX;
  vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
  *in_RSI;
  polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_> *in_RDI;
  size_t i;
  optional<std::pair<pbrt::LightHandle,_unsigned_long>_> *in_stack_ffffffffffffffc8;
  vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
  *local_28;
  
  in_RDI->memoryResource = (memory_resource *)*in_RCX;
  in_RDI[1].memoryResource = (memory_resource *)0x0;
  in_RDI[2].memoryResource = (memory_resource *)0x0;
  in_RDI[3].memoryResource = (memory_resource *)0x0;
  reserve(in_RSI,in_RDX);
  for (local_28 = (vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
                   *)0x0; local_28 < in_RSI;
      local_28 = (vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
                  *)((long)&(local_28->alloc).memoryResource + 1)) {
    pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,unsigned_long>>>::
    construct<pstd::optional<std::pair<pbrt::LightHandle,unsigned_long>>,pstd::optional<std::pair<pbrt::LightHandle,unsigned_long>>const&>
              (in_RDI,in_stack_ffffffffffffffc8,
               (optional<std::pair<pbrt::LightHandle,_unsigned_long>_> *)0x7243d0);
  }
  in_RDI[3].memoryResource = (memory_resource *)in_RSI;
  return;
}

Assistant:

vector(size_t count, const T &value, const Allocator &alloc = {}) : alloc(alloc) {
        reserve(count);
        for (size_t i = 0; i < count; ++i)
            this->alloc.template construct<T>(ptr + i, value);
        nStored = count;
    }